

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O0

const_iterator __thiscall QSet<QGraphicsItem_*>::begin(QSet<QGraphicsItem_*> *this)

{
  const_iterator o;
  size_t extraout_RDX;
  Data<QHashPrivate::Node<QGraphicsItem_*,_QHashDummyValue>_> *in_RDI;
  const_iterator cVar1;
  const_iterator *in_stack_ffffffffffffffc8;
  Data<QHashPrivate::Node<QGraphicsItem_*,_QHashDummyValue>_> *pDVar2;
  undefined8 local_20;
  
  pDVar2 = in_RDI;
  QHash<QGraphicsItem_*,_QHashDummyValue>::begin(local_20);
  o.i.bucket = (size_t)pDVar2;
  o.i.d = in_RDI;
  const_iterator::const_iterator(in_stack_ffffffffffffffc8,o);
  cVar1.i.i.bucket = extraout_RDX;
  cVar1.i.i.d = pDVar2;
  return (const_iterator)cVar1.i.i;
}

Assistant:

inline const_iterator begin() const noexcept { return q_hash.begin(); }